

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Tensor::InternalSwap(Tensor *this,Tensor *other)

{
  uint32 uVar1;
  int iVar2;
  
  google::protobuf::RepeatedField<long>::InternalSwap(&this->dimvalue_,&other->dimvalue_);
  uVar1 = this->rank_;
  this->rank_ = other->rank_;
  other->rank_ = uVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void Tensor::InternalSwap(Tensor* other) {
  dimvalue_.InternalSwap(&other->dimvalue_);
  std::swap(rank_, other->rank_);
  std::swap(_cached_size_, other->_cached_size_);
}